

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall TimerHeap::modify(TimerHeap *this,size_t index)

{
  pointer psVar1;
  bool bVar2;
  
  if (index != 0) {
    psVar1 = (this->timerHeap_).
             super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar2 = Timer::timeType_::operator<
                      (&(psVar1[index].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->timeout_,
                       *(timeType_ **)
                        ((long)&(psVar1->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr + (index * 8 - 8 & 0xfffffffffffffff0)));
    if (bVar2) {
      upHeap(this,index);
      return;
    }
  }
  downHeap(this,index);
  return;
}

Assistant:

void TimerHeap::modify(size_t index) {
    size_t parent = (index - 1) / 2;
    if (index > 0 && timerHeap_[index]->timeout_ < timerHeap_[parent]->timeout_)
        upHeap(index);
    else 
        downHeap(index);
}